

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O0

void __thiscall kratos::FSM::realize(FSM *this)

{
  Generator *pGVar1;
  undefined1 auVar2 [8];
  bool bVar3;
  bool bVar4;
  VarType VVar5;
  UserException *pUVar6;
  uint *puVar7;
  FSM *this_00;
  string *psVar8;
  Enum *this_01;
  element_type *peVar9;
  EnumVar *pEVar10;
  vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
  *this_02;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *this_03;
  element_type *peVar11;
  element_type *peVar12;
  element_type *peVar13;
  bool *pbVar14;
  mapped_type *pmVar15;
  element_type *peVar16;
  ulong uVar17;
  element_type *peVar18;
  reference ppFVar19;
  char (*format_str) [17];
  remove_reference_t<std::__cxx11::basic_string<char>_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  __type_conflict4 __x;
  double dVar20;
  undefined1 auVar21 [16];
  pair<const_char_*,_int> pVar22;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  byte local_9b3;
  byte local_9ad;
  FSM **fsm_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> *__range1_1;
  vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> fsms;
  int local_7c4;
  pair<const_char_*,_int> local_7c0;
  shared_ptr<kratos::Stmt> local_7b0;
  shared_ptr<kratos::Stmt> local_7a0;
  char *local_790;
  int local_788;
  int local_77c;
  pair<const_char_*,_int> local_778;
  enable_shared_from_this<kratos::Var> local_768;
  undefined1 local_758 [8];
  shared_ptr<kratos::AssignStmt> stmt_1;
  int local_734;
  pair<const_char_*,_int> local_730;
  shared_ptr<kratos::Stmt> local_720;
  undefined1 local_710 [32];
  undefined1 local_6f0 [8];
  shared_ptr<kratos::AssignStmt> stmt;
  string local_6d8 [8];
  mapped_type start_state_name;
  shared_ptr<kratos::IfStmt> seq_if;
  undefined1 local_698 [8];
  shared_ptr<kratos::Var> predicate;
  int local_674;
  undefined1 local_670 [20];
  EventEdgeType local_65c;
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> local_658;
  EventEdgeType local_63c;
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> local_638;
  byte local_619;
  undefined1 local_618 [21];
  _Optional_payload_base<bool> local_603;
  byte local_601;
  undefined1 local_600 [18];
  _Optional_payload_base<bool> local_5ee;
  EventEdgeType local_5ec;
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> local_5e8;
  bool local_5c9;
  undefined1 local_5c8 [7];
  bool reset_high;
  shared_ptr<kratos::SequentialStmtBlock> seq;
  int local_5a4;
  pair<const_char_*,_int> local_5a0;
  undefined1 local_590 [20];
  int local_57c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_578;
  enable_shared_from_this<kratos::Enum> local_568;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_558;
  EnumVar *next_state;
  undefined1 local_540 [8];
  EnumVar *current_state;
  string local_530;
  undefined1 local_510 [8];
  string next_state_name;
  string local_4e8;
  undefined1 local_4c8 [8];
  string current_state_name;
  mapped_type state_name_1;
  string local_480;
  _Node_iterator_base<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_460;
  _Node_iterator_base<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_458;
  undefined1 local_450 [24];
  element_type *s;
  type *info;
  type *name;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_true>
  local_420;
  iterator __end3;
  iterator __begin3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  *__range3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  fn_ln;
  _Node_iterator_base<const_kratos::FSM_*,_false> local_3c8;
  FSM *local_3c0;
  FSM *fsm;
  FSMState **state_1;
  iterator __end2;
  iterator __begin2;
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *__range2;
  unordered_set<const_kratos::FSM_*,_std::hash<const_kratos::FSM_*>,_std::equal_to<const_kratos::FSM_*>,_std::allocator<const_kratos::FSM_*>_>
  visited;
  Enum *enum_def;
  _Base_ptr local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  undefined1 local_2d0 [8];
  string state_name;
  FSMState **state;
  iterator __end1;
  iterator __begin1;
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *__range1;
  undefined1 local_288 [7];
  bool has_child_state;
  unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  state_name_mapping;
  _Rb_tree_node_base local_248;
  _Base_ptr local_228;
  uint64_t count;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  raw_def;
  uint local_1e8;
  uint local_1e4;
  undefined1 local_1dd;
  uint32_t width;
  string local_1d0;
  size_type local_1b0;
  uint64_t num_states;
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> states;
  FSM *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_180;
  basic_string_view<char> local_178;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_168;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_158;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  __node_base_ptr local_148;
  string *local_140;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_138;
  basic_string_view<char> local_128;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_118;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_108;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  _Base_ptr local_f8;
  _Rb_tree_node_base *local_f0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_e8;
  basic_string_view<char> local_d8;
  undefined1 local_c8 [40];
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_2;
  string *local_98;
  __node_base local_90;
  string *local_88;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_80;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_70;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_60;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_38;
  ModuleInstantiationStmt *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  ModuleInstantiationStmt *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  ModuleInstantiationStmt *local_10;
  
  if ((this->realized_ & 1U) != 0) {
    return;
  }
  states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  get_all_child_states
            ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)&num_states,this,
             false);
  local_1b0 = std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::size
                        ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)
                         &num_states);
  if (local_1b0 == 0) {
    local_1dd = 1;
    pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)fsm_name_abi_cxx11_(this);
    local_140 = &local_1d0;
    local_148 = (__node_base_ptr)0x42c81e;
    local_168.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string_const&,char[17],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"FSM {0} is empty",(v7 *)vargs,format_str,
                    (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                    "FSM {0} is empty");
    local_158 = &local_168;
    local_178 = fmt::v7::to_string_view<char,_0>((char *)local_148);
    local_78 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_80 = local_158;
    local_70 = local_158;
    local_60 = local_158;
    local_68 = local_78;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_78,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_158->string);
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_180.values_;
    format_str_00.size_ = (size_t)this_local;
    format_str_00.data_ = (char *)local_178.size_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_1d0,(detail *)local_178.data_,format_str_00,args);
    UserException::UserException(pUVar6,&local_1d0);
    local_1dd = 0;
    __cxa_throw(pUVar6,&UserException::typeinfo,UserException::~UserException);
  }
  local_1e8 = 1;
  __x = std::log2<unsigned_long>(local_1b0);
  dVar20 = ceil(__x);
  raw_def._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = (undefined4)(long)dVar20;
  puVar7 = std::max<unsigned_int>
                     (&local_1e8,
                      (uint *)((long)&raw_def._M_t._M_impl.super__Rb_tree_header._M_node_count + 4))
  ;
  local_1e4 = *puVar7;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         *)&count);
  local_228 = (_Base_ptr)0x0;
  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->start_state_);
  if (!bVar3) {
    state_name_mapping._M_h._M_single_bucket._7_1_ = 1;
    auVar21 = __cxa_allocate_exception(0x10);
    local_f0 = &local_248;
    local_f8 = (_Base_ptr)0x42c82f;
    vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this;
    local_118.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string&,char[35],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"FSM {0} doesn\'t have a start state",(v7 *)this,auVar21._8_8_,
                    (remove_reference_t<std::__cxx11::basic_string<char>_&> *)
                    "FSM {0} doesn\'t have a start state");
    local_108 = &local_118;
    local_128 = fmt::v7::to_string_view<char,_0>((char *)local_f8);
    local_50 = &local_138;
    local_58 = local_108;
    local_48 = local_108;
    local_38 = local_108;
    local_40 = local_50;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_50,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_108->string);
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_138.field_1.values_;
    format_str_01.size_ = local_138.desc_;
    format_str_01.data_ = (char *)local_128.size_;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)&local_248,(detail *)local_128.data_,format_str_01,args_00);
    UserException::UserException(auVar21._0_8_,(string *)&local_248);
    state_name_mapping._M_h._M_single_bucket._7_1_ = 0;
    __cxa_throw(auVar21._0_8_,&UserException::typeinfo,UserException::~UserException);
  }
  std::
  unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_288);
  bVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>_>
          ::empty(&this->child_fsms_);
  __end1 = std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::begin
                     ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)&num_states
                     );
  state = (FSMState **)
          std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::end
                    ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)&num_states)
  ;
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<kratos::FSMState_**,_std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
                                     *)&state), bVar4) {
    state_name.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<kratos::FSMState_**,_std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
         ::operator*(&__end1);
    std::__cxx11::string::string((string *)local_2d0);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      psVar8 = FSMState::name_abi_cxx11_(*(FSMState **)state_name.field_2._8_8_);
      std::__cxx11::string::operator=((string *)local_2d0,(string *)psVar8);
    }
    else {
      this_00 = FSMState::parent(*(FSMState **)state_name.field_2._8_8_);
      psVar8 = fsm_name_abi_cxx11_(this_00);
      std::operator+(&local_310,psVar8,"_");
      psVar8 = FSMState::name_abi_cxx11_(*(FSMState **)state_name.field_2._8_8_);
      std::operator+(&local_2f0,&local_310,psVar8);
      std::__cxx11::string::operator=((string *)local_2d0,(string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
    }
    local_318 = local_228;
    local_228 = (_Base_ptr)((long)&local_228->_M_color + 1);
    std::
    map<std::__cxx11::string,unsigned_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
    ::emplace<std::__cxx11::string&,unsigned_long>
              ((map<std::__cxx11::string,unsigned_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                *)&count,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
               (unsigned_long *)&local_318);
    std::
    unordered_map<kratos::FSMState*,std::__cxx11::string,std::hash<kratos::FSMState*>,std::equal_to<kratos::FSMState*>,std::allocator<std::pair<kratos::FSMState*const,std::__cxx11::string>>>
    ::emplace<kratos::FSMState*const&,std::__cxx11::string&>
              ((unordered_map<kratos::FSMState*,std::__cxx11::string,std::hash<kratos::FSMState*>,std::equal_to<kratos::FSMState*>,std::allocator<std::pair<kratos::FSMState*const,std::__cxx11::string>>>
                *)local_288,(FSMState **)state_name.field_2._8_8_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
    FSMState::check_outputs(*(FSMState **)state_name.field_2._8_8_);
    std::__cxx11::string::~string((string *)local_2d0);
    __gnu_cxx::
    __normal_iterator<kratos::FSMState_**,_std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
    ::operator++(&__end1);
  }
  pGVar1 = this->generator_;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &visited._M_h._M_single_bucket,&this->fsm_name_,"_state");
  this_01 = Generator::enum_(pGVar1,(string *)&visited._M_h._M_single_bucket,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                              *)&count,local_1e4);
  std::__cxx11::string::~string((string *)&visited._M_h._M_single_bucket);
  if ((this->generator_->debug & 1U) != 0) {
    std::
    unordered_set<const_kratos::FSM_*,_std::hash<const_kratos::FSM_*>,_std::equal_to<const_kratos::FSM_*>,_std::allocator<const_kratos::FSM_*>_>
    ::unordered_set((unordered_set<const_kratos::FSM_*,_std::hash<const_kratos::FSM_*>,_std::equal_to<const_kratos::FSM_*>,_std::allocator<const_kratos::FSM_*>_>
                     *)&__range2);
    __end2 = std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::begin
                       ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)
                        &num_states);
    state_1 = (FSMState **)
              std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::end
                        ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)
                         &num_states);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<kratos::FSMState_**,_std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
                                       *)&state_1), bVar3) {
      fsm = (FSM *)__gnu_cxx::
                   __normal_iterator<kratos::FSMState_**,_std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
                   ::operator*(&__end2);
      local_3c0 = FSMState::parent(*(FSMState **)&fsm->fsm_name_);
      local_3c8._M_cur =
           (__node_type *)
           std::
           unordered_set<const_kratos::FSM_*,_std::hash<const_kratos::FSM_*>,_std::equal_to<const_kratos::FSM_*>,_std::allocator<const_kratos::FSM_*>_>
           ::find((unordered_set<const_kratos::FSM_*,_std::hash<const_kratos::FSM_*>,_std::equal_to<const_kratos::FSM_*>,_std::allocator<const_kratos::FSM_*>_>
                   *)&__range2,&local_3c0);
      fn_ln._M_h._M_single_bucket =
           (__node_base_ptr)
           std::
           unordered_set<const_kratos::FSM_*,_std::hash<const_kratos::FSM_*>,_std::equal_to<const_kratos::FSM_*>,_std::allocator<const_kratos::FSM_*>_>
           ::end((unordered_set<const_kratos::FSM_*,_std::hash<const_kratos::FSM_*>,_std::equal_to<const_kratos::FSM_*>,_std::allocator<const_kratos::FSM_*>_>
                  *)&__range2);
      bVar3 = std::__detail::operator!=
                        (&local_3c8,
                         (_Node_iterator_base<const_kratos::FSM_*,_false> *)
                         &fn_ln._M_h._M_single_bucket);
      if (!bVar3) {
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
        ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                         *)&__range3,&local_3c0->fn_name_ln_);
        __end3 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                 ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                          *)&__range3);
        local_420._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                    *)&__range3);
        while (bVar3 = std::__detail::operator!=
                                 (&__end3.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_true>
                                  ,&local_420), bVar3) {
          name = &std::__detail::
                  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_false,_true>
                  ::operator*(&__end3)->first;
          info = (type *)std::
                         get<0ul,std::__cxx11::string_const,std::pair<std::__cxx11::string,unsigned_int>>
                                   ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                                     *)name);
          s = (element_type *)
              std::get<1ul,std::__cxx11::string_const,std::pair<std::__cxx11::string,unsigned_int>>
                        ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                          *)name);
          get_state((FSM *)local_450,&local_3c0->fsm_name_);
          peVar9 = std::__shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>::get
                             ((__shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2> *)
                              local_450);
          std::shared_ptr<kratos::FSMState>::~shared_ptr((shared_ptr<kratos::FSMState> *)local_450);
          local_450._16_8_ = peVar9;
          local_458._M_cur =
               (__node_type *)
               std::
               unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find((unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_288,(key_type *)fsm);
          local_460._M_cur =
               (__node_type *)
               std::
               unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end((unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_288);
          bVar3 = std::__detail::operator==(&local_458,&local_460);
          if (bVar3) {
            pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
            local_98 = FSMState::name_abi_cxx11_((FSMState *)local_450._16_8_);
            local_88 = &local_480;
            local_90._M_nxt = (_Hash_node_base *)0x42c852;
            vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this;
            fmt::v7::
            make_args_checked<std::__cxx11::string_const&,std::__cxx11::string&,char[72],char>
                      ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_c8,
                       (v7 *)
                       "Unable to find state name {0} from FSM {1}. Is it a disconnected state?",
                       (char (*) [72])local_98,&this->fsm_name_,in_R8);
            local_c8._32_8_ = local_c8;
            local_d8 = fmt::v7::to_string_view<char,_0>((char *)local_90._M_nxt);
            local_28 = &local_e8;
            local_30 = (ModuleInstantiationStmt *)local_c8._32_8_;
            local_20 = (ModuleInstantiationStmt *)local_c8._32_8_;
            local_10 = (ModuleInstantiationStmt *)local_c8._32_8_;
            local_18 = local_28;
            fmt::v7::
            basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            ::basic_format_args(local_28,0xdd,
                                (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                 *)local_c8._32_8_);
            args_01.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.values_ = in_R9.values_;
            args_01.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)local_e8.field_1.values_;
            format_str_02.size_ = local_e8.desc_;
            format_str_02.data_ = (char *)local_d8.size_;
            fmt::v7::detail::vformat_abi_cxx11_
                      (&local_480,(detail *)local_d8.data_,format_str_02,args_01);
            UserException::UserException(pUVar6,&local_480);
            __cxa_throw(pUVar6,&UserException::typeinfo,UserException::~UserException);
          }
          pmVar15 = std::
                    unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::at((unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_288,(key_type *)fsm);
          std::__cxx11::string::string
                    ((string *)(current_state_name.field_2._M_local_buf + 8),(string *)pmVar15);
          Enum::add_debug_info
                    (this_01,(string *)((long)&current_state_name.field_2 + 8),
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                      *)s);
          std::__cxx11::string::~string((string *)(current_state_name.field_2._M_local_buf + 8));
          std::__detail::
          _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_false,_true>
          ::operator++(&__end3);
        }
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
        ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                          *)&__range3);
      }
      __gnu_cxx::
      __normal_iterator<kratos::FSMState_**,_std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
      ::operator++(&__end2);
    }
    std::
    unordered_set<const_kratos::FSM_*,_std::hash<const_kratos::FSM_*>,_std::equal_to<const_kratos::FSM_*>,_std::allocator<const_kratos::FSM_*>_>
    ::~unordered_set((unordered_set<const_kratos::FSM_*,_std::hash<const_kratos::FSM_*>,_std::equal_to<const_kratos::FSM_*>,_std::allocator<const_kratos::FSM_*>_>
                      *)&__range2);
  }
  pGVar1 = this->generator_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e8,"current_state",
             (allocator<char> *)(next_state_name.field_2._M_local_buf + 0xf));
  Generator::get_unique_variable_name((string *)local_4c8,pGVar1,&this->fsm_name_,&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)(next_state_name.field_2._M_local_buf + 0xf));
  pGVar1 = this->generator_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"next_state",(allocator<char> *)((long)&current_state + 7));
  Generator::get_unique_variable_name((string *)local_510,pGVar1,&this->fsm_name_,&local_530);
  std::__cxx11::string::~string((string *)&local_530);
  std::allocator<char>::~allocator((allocator<char> *)((long)&current_state + 7));
  pGVar1 = this->generator_;
  std::enable_shared_from_this<kratos::Enum>::shared_from_this
            ((enable_shared_from_this<kratos::Enum> *)&next_state);
  pEVar10 = Generator::enum_var(pGVar1,(string *)local_4c8,(shared_ptr<kratos::Enum> *)&next_state);
  std::shared_ptr<kratos::Enum>::~shared_ptr((shared_ptr<kratos::Enum> *)&next_state);
  this->current_state_ = pEVar10;
  pGVar1 = this->generator_;
  local_540 = (undefined1  [8])pEVar10;
  std::enable_shared_from_this<kratos::Enum>::shared_from_this(&local_568);
  pEVar10 = Generator::enum_var(pGVar1,(string *)local_510,(shared_ptr<kratos::Enum> *)&local_568);
  std::shared_ptr<kratos::Enum>::~shared_ptr((shared_ptr<kratos::Enum> *)&local_568);
  local_558._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pEVar10;
  if ((this->generator_->debug & 1U) != 0) {
    this_02 = (vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
               *)((long)local_540 + 8);
    local_57c = 0x95;
    pVar22 = std::make_pair<char_const(&)[76],int>
                       ((char (*) [76])
                        "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/fsm.cc"
                        ,&local_57c);
    local_590._0_8_ = pVar22.first;
    local_590._8_4_ = pVar22.second;
    local_578._M_allocated_capacity = local_590._0_8_;
    local_578._8_4_ = local_590._8_4_;
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>(this_02,(pair<const_char_*,_int> *)&local_578);
    this_03 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *)&(local_558._M_pi)->_M_use_count;
    local_5a4 = 0x96;
    pVar22 = std::make_pair<char_const(&)[76],int>
                       ((char (*) [76])
                        "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/fsm.cc"
                        ,&local_5a4);
    seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVar22.first;
    local_5a0.second = pVar22.second;
    local_5a0.first =
         (char *)seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)this_03,&local_5a0);
  }
  Generator::sequential((Generator *)local_5c8);
  local_5c9 = true;
  peVar11 = std::
            __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_5c8);
  local_5ec = Posedge;
  std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_&,_true>
            (&local_5e8,&local_5ec,&this->clk_);
  SequentialStmtBlock::add_condition(peVar11,&local_5e8);
  std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::~pair(&local_5e8);
  peVar12 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )&this->reset_);
  local_601 = 0;
  local_619 = 0;
  VVar5 = Var::type(peVar12);
  local_9ad = 0;
  if (VVar5 != PortIO) goto LAB_003c3232;
  std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &this->reset_);
  Var::as<kratos::Port>((Var *)local_600);
  local_601 = 1;
  peVar13 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_600);
  local_5ee = (_Optional_payload_base<bool>)Port::active_high(peVar13);
  bVar3 = std::optional::operator_cast_to_bool((optional *)&local_5ee);
  if (bVar3) {
    std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &this->reset_);
    Var::as<kratos::Port>((Var *)local_618);
    local_619 = 1;
    peVar13 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_618);
    local_603 = (_Optional_payload_base<bool>)Port::active_high(peVar13);
    pbVar14 = std::optional<bool>::operator*((optional<bool> *)&local_603);
    local_9b3 = 1;
    if ((*pbVar14 & 1U) != 0) goto LAB_003c3211;
  }
  else {
LAB_003c3211:
    local_9b3 = this->reset_high_ ^ 0xff;
  }
  local_9ad = local_9b3;
LAB_003c3232:
  if ((local_619 & 1) != 0) {
    std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)local_618);
  }
  if ((local_601 & 1) != 0) {
    std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)local_600);
  }
  bVar3 = (local_9ad & 1) != 0;
  if (bVar3) {
    peVar11 = std::
              __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_5c8);
    local_63c = Negedge;
    std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::
    pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_&,_true>
              (&local_638,&local_63c,&this->reset_);
    SequentialStmtBlock::add_condition(peVar11,&local_638);
    std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::~pair(&local_638);
  }
  else {
    peVar11 = std::
              __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_5c8);
    local_65c = Posedge;
    std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::
    pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_&,_true>
              (&local_658,&local_65c,&this->reset_);
    SequentialStmtBlock::add_condition(peVar11,&local_658);
    std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::~pair(&local_658);
  }
  local_5c9 = !bVar3;
  if ((this->generator_->debug & 1U) != 0) {
    peVar11 = std::
              __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_5c8);
    local_674 = 0xab;
    pVar22 = std::make_pair<char_const(&)[76],int>
                       ((char (*) [76])
                        "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/fsm.cc"
                        ,&local_674);
    predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVar22.first;
    local_670._8_4_ = pVar22.second;
    local_670._0_8_ =
         predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&(peVar11->super_StmtBlock).super_Stmt.super_IRNode.fn_name_ln,
               (pair<const_char_*,_int> *)local_670);
  }
  std::shared_ptr<kratos::Var>::shared_ptr((shared_ptr<kratos::Var> *)local_698);
  if ((local_5c9 & 1U) == 0) {
    peVar12 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->reset_);
    Var::r_not(peVar12);
    Var::as<kratos::Var>
              ((Var *)&seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
    std::shared_ptr<kratos::Var>::operator=
              ((shared_ptr<kratos::Var> *)local_698,
               (shared_ptr<kratos::Var> *)
               &seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<kratos::Var>::~shared_ptr
              ((shared_ptr<kratos::Var> *)
               &seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    std::shared_ptr<kratos::Var>::operator=((shared_ptr<kratos::Var> *)local_698,&this->reset_);
  }
  std::make_shared<kratos::IfStmt,std::shared_ptr<kratos::Var>&>
            ((shared_ptr<kratos::Var> *)((long)&start_state_name.field_2 + 8));
  stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::__shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>::get
                 (&(this->start_state_).
                   super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>);
  pmVar15 = std::
            unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at((unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_288,
                 (key_type *)
                 &stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  std::__cxx11::string::string(local_6d8,(string *)pmVar15);
  auVar2 = local_540;
  Enum::get_enum((Enum *)local_710,(string *)this_01);
  std::shared_ptr<kratos::Var>::shared_ptr<kratos::EnumConst,void>
            ((shared_ptr<kratos::Var> *)(local_710 + 0x10),
             (shared_ptr<kratos::EnumConst> *)local_710);
  Var::assign((Var *)local_6f0,(shared_ptr<kratos::Var> *)auVar2,
              (AssignmentType)(shared_ptr<kratos::Var> *)(local_710 + 0x10));
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)(local_710 + 0x10));
  std::shared_ptr<kratos::EnumConst>::~shared_ptr((shared_ptr<kratos::EnumConst> *)local_710);
  peVar16 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)(start_state_name.field_2._M_local_buf + 8));
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            (&local_720,(shared_ptr<kratos::AssignStmt> *)local_6f0);
  IfStmt::add_then_stmt(peVar16,&local_720);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_720);
  if ((this->generator_->debug & 1U) != 0) {
    uVar17 = std::__cxx11::string::empty();
    if ((uVar17 & 1) == 0) {
      peVar18 = std::
                __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_6f0);
      std::
      vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
      ::emplace_back<std::pair<std::__cxx11::string,unsigned_int>&>
                ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                  *)&(peVar18->super_Stmt).super_IRNode.fn_name_ln,&this->start_state_debug_);
    }
    peVar18 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_6f0);
    local_734 = 0xbf;
    pVar22 = std::make_pair<char_const(&)[76],int>
                       ((char (*) [76])
                        "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/fsm.cc"
                        ,&local_734);
    stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVar22.first;
    local_730.second = pVar22.second;
    local_730.first =
         (char *)stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&(peVar18->super_Stmt).super_IRNode.fn_name_ln,&local_730);
  }
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_6f0);
  std::__cxx11::string::~string(local_6d8);
  auVar2 = local_540;
  std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_768);
  Var::assign((Var *)local_758,(shared_ptr<kratos::Var> *)auVar2,(AssignmentType)&local_768);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_768);
  if ((this->generator_->debug & 1U) != 0) {
    peVar18 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_758);
    local_77c = 0xc5;
    pVar22 = std::make_pair<char_const(&)[76],int>
                       ((char (*) [76])
                        "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/fsm.cc"
                        ,&local_77c);
    local_790 = pVar22.first;
    local_788 = pVar22.second;
    local_778.first = local_790;
    local_778.second = local_788;
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&(peVar18->super_Stmt).super_IRNode.fn_name_ln,&local_778);
  }
  peVar16 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)(start_state_name.field_2._M_local_buf + 8));
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            (&local_7a0,(shared_ptr<kratos::AssignStmt> *)local_758);
  IfStmt::add_else_stmt(peVar16,&local_7a0);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_7a0);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_758);
  peVar11 = std::
            __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_5c8);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::IfStmt,void>
            (&local_7b0,(shared_ptr<kratos::IfStmt> *)((long)&start_state_name.field_2 + 8));
  StmtBlock::add_stmt(&peVar11->super_StmtBlock,&local_7b0);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_7b0);
  if ((this->generator_->debug & 1U) != 0) {
    peVar16 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)(start_state_name.field_2._M_local_buf + 8));
    local_7c4 = 0xca;
    pVar22 = std::make_pair<char_const(&)[76],int>
                       ((char (*) [76])
                        "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/fsm.cc"
                        ,&local_7c4);
    fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pVar22.first;
    local_7c0.second = pVar22.second;
    local_7c0.first =
         (char *)fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&(peVar16->super_Stmt).super_IRNode.fn_name_ln,&local_7c0);
  }
  generate_state_transition
            (this,this_01,(EnumVar *)local_540,(EnumVar *)local_558._M_pi,
             (unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_288);
  if ((this->moore_ & 1U) != 0) {
    generate_output(this,this_01,(EnumVar *)local_540,
                    (unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_288);
  }
  get_all_child_fsm((vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> *)&__range1_1,this);
  __end1_1 = std::vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>::begin
                       ((vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> *)&__range1_1);
  fsm_1 = (FSM **)std::vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>::end
                            ((vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> *)&__range1_1);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<kratos::FSM_**,_std::vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>_>
                             *)&fsm_1), bVar3) {
    ppFVar19 = __gnu_cxx::
               __normal_iterator<kratos::FSM_**,_std::vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>_>
               ::operator*(&__end1_1);
    (*ppFVar19)->realized_ = true;
    __gnu_cxx::
    __normal_iterator<kratos::FSM_**,_std::vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>_>::
    operator++(&__end1_1);
  }
  this->realized_ = true;
  std::vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>::~vector
            ((vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> *)&__range1_1);
  std::shared_ptr<kratos::IfStmt>::~shared_ptr
            ((shared_ptr<kratos::IfStmt> *)((long)&start_state_name.field_2 + 8));
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_698);
  std::shared_ptr<kratos::SequentialStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::SequentialStmtBlock> *)local_5c8);
  std::__cxx11::string::~string((string *)local_510);
  std::__cxx11::string::~string((string *)local_4c8);
  std::
  unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map((unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_288);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *)&count);
  std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::~vector
            ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)&num_states);
  return;
}

Assistant:

void FSM::realize() {
    // never realize again
    if (realized_) return;
    // generate the statements to the generator
    // first, get state and next state variable
    // compute number of states
    auto states = get_all_child_states(false);
    uint64_t num_states = states.size();
    if (!num_states) throw UserException(::format("FSM {0} is empty", fsm_name()));
    uint32_t width = std::max<uint32_t>(1u, std::ceil(std::log2(num_states)));
    // define a enum type
    std::map<std::string, uint64_t> raw_def;
    uint64_t count = 0;
    if (!start_state_)
        throw UserException(::format("FSM {0} doesn't have a start state", fsm_name_));
    // name mapping
    std::unordered_map<FSMState*, std::string> state_name_mapping;
    bool has_child_state = !child_fsms_.empty();
    for (auto const& state : states) {
        // notice that we need to do an additional mapping if it's a nested fsm
        // to avoid any name conflicts
        std::string state_name;
        if (has_child_state) {
            state_name = state->parent()->fsm_name() + "_" + state->name();
        } else {
            state_name = state->name();
        }
        raw_def.emplace(state_name, count++);
        state_name_mapping.emplace(state, state_name);
        // check states
        state->check_outputs();
    }
    auto& enum_def = generator_->enum_(fsm_name_ + "_state", raw_def, width);
    // add debug info
    if (generator_->debug) {
        std::unordered_set<const FSM*> visited;
        for (auto const& state : states) {
            const auto* fsm = state->parent();
            if (visited.find(fsm) != visited.end()) continue;
            auto fn_ln = fsm->fn_name_ln_;
            for (auto const& [name, info] : fn_ln) {
                auto* s = fsm->get_state(name).get();
                if (state_name_mapping.find(state) == state_name_mapping.end()) {
                    throw UserException(::format(
                        "Unable to find state name {0} from FSM {1}. Is it a disconnected state?",
                        s->name(), fsm_name_));
                }
                auto state_name = state_name_mapping.at(state);
                enum_def.add_debug_info(state_name, info);
            }
        }
    }
    // create two state variable, current_state, and next_state
    auto current_state_name = generator_->get_unique_variable_name(fsm_name_, "current_state");
    auto next_state_name = generator_->get_unique_variable_name(fsm_name_, "next_state");
    auto& current_state = generator_->enum_var(current_state_name, enum_def.shared_from_this());
    current_state_ = &current_state;
    auto& next_state = generator_->enum_var(next_state_name, enum_def.shared_from_this());
    if (generator_->debug) {
        current_state.fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
        next_state.fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
    }

    // sequential logic
    // if (reset)
    //   current_state <= default_state
    // else
    //   current_state <= next_state
    auto seq = generator_->sequential();
    bool reset_high = true;
    seq->add_condition({EventEdgeType::Posedge, clk_});
    if (reset_->type() == VarType::PortIO &&
        ((reset_->as<Port>()->active_high() && !(*reset_->as<Port>()->active_high())) ||
         !reset_high_)) {
        seq->add_condition({EventEdgeType::Negedge, reset_});
        reset_high = false;
    } else {
        seq->add_condition({EventEdgeType::Posedge, reset_});
        reset_high = true;
    }
    if (generator_->debug) {
        seq->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
    }

    std::shared_ptr<Var> predicate;
    if (reset_high) {
        predicate = reset_;
    } else {
        predicate = (reset_->r_not()).as<Var>();
    }

    auto seq_if = std::make_shared<IfStmt>(predicate);
    {
        auto start_state_name = state_name_mapping.at(start_state_.get());
        auto stmt =
            current_state.assign(enum_def.get_enum(start_state_name), AssignmentType::NonBlocking);
        seq_if->add_then_stmt(stmt);
        if (generator_->debug) {
            if (!start_state_debug_.first.empty()) {
                stmt->fn_name_ln.emplace_back(start_state_debug_);
            }
            stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
        }
    }
    {
        auto stmt =
            current_state.assign(next_state.shared_from_this(), AssignmentType::NonBlocking);
        if (generator_->debug) stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
        seq_if->add_else_stmt(stmt);
    }
    // add it to the seq
    seq->add_stmt(seq_if);
    if (generator_->debug) seq_if->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));

    // combination logic to compute next state
    generate_state_transition(enum_def, current_state, next_state, state_name_mapping);

    // now the output logic
    // only generate output state block in moore machine. in mealy machine, the output
    // is fused inside the state transition.
    if (moore_) generate_output(enum_def, current_state, state_name_mapping);

    // set to realized for all states
    auto fsms = get_all_child_fsm();
    for (auto& fsm : fsms) fsm->realized_ = true;
    realized_ = true;
}